

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

void __thiscall Tokenizer::readAll(Tokenizer *this)

{
  char cVar1;
  istream *piVar2;
  string tp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->_initialized == false) {
    local_70 = &local_60;
    local_68 = 0;
    local_60 = 0;
    while( true ) {
      piVar2 = this->_rdr;
      cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar2 + -0x18) + (char)piVar2);
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (piVar2,(string *)&local_70,cVar1);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_70,local_70 + local_68);
      std::__cxx11::string::append((char *)&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->_lines_buffer,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    this->_initialized = true;
    (this->_ptr).first = 0;
    (this->_ptr).second = 0;
  }
  return;
}

Assistant:

void Tokenizer::readAll() {
	if (_initialized)
		return;
	for (std::string tp; std::getline(_rdr, tp);)
		_lines_buffer.emplace_back(std::move(tp + "\n"));
	_initialized = true;
	_ptr = std::make_pair<int64_t, int64_t>(0, 0);
	return;
}